

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O1

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  SQInteger SVar4;
  SQChar *pSVar5;
  long lVar6;
  SQInteger SVar7;
  long lVar8;
  longlong lVar9;
  size_t sVar10;
  SQRESULT SVar11;
  char cVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  char *pcVar17;
  long lVar18;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar *format;
  SQChar fmt [20];
  char *local_b0;
  SQRESULT local_a8;
  long local_a0;
  HSQUIRRELVM local_98;
  size_t local_90;
  SQFloat local_84;
  SQChar *local_80;
  char *local_78;
  undefined8 local_70;
  char local_68 [24];
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  long local_38;
  
  local_50 = outlen;
  local_48 = output;
  sq_getstring(v,nformatstringidx,(SQChar **)&local_70);
  SVar4 = sq_getsize(v,nformatstringidx);
  local_90 = SVar4 + 2;
  pSVar5 = sq_getscratchpad(v,local_90);
  if (SVar4 < 1) {
    lVar18 = 0;
LAB_0013608d:
    *local_50 = lVar18;
    pSVar5[lVar18] = '\0';
    *local_48 = pSVar5;
    return 0;
  }
  lVar15 = nformatstringidx + 1;
  lVar18 = 0;
  lVar13 = 0;
  local_a0 = 0;
  local_98 = v;
LAB_00135cc9:
  cVar12 = local_70[lVar13];
  lVar6 = 1;
  if (cVar12 == '%') {
    if (local_70[lVar13 + 1] == '%') {
      lVar6 = 2;
      cVar12 = '%';
      goto LAB_00135ce9;
    }
    local_80 = pSVar5;
    SVar7 = sq_gettop(v);
    pSVar5 = local_70;
    if (SVar7 < lVar15) {
      SVar11 = sq_throwerror(v,"not enough parameters for the given format string");
      return SVar11;
    }
    lVar6 = lVar13 + 1;
    local_68[0] = '%';
    pcVar17 = local_70 + lVar13 + 2;
    lVar14 = lVar13 + 2;
    lVar13 = lVar6;
    while (((ulong)(byte)local_70[lVar13] < 0x31 &&
           ((0x1280900000000U >> ((ulong)(byte)local_70[lVar13] & 0x3f) & 1) != 0))) {
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 1;
      pcVar17 = pcVar17 + 1;
    }
    lVar8 = 0;
    do {
      local_38 = lVar15;
      if (9 < (int)local_70[lVar13] - 0x30U) {
        *(undefined1 *)((long)&local_b0 + lVar8) = 0;
        if (lVar8 == 0) {
          local_a0 = 0;
        }
        else {
          local_40 = lVar18;
          local_a0 = strtoll((char *)&local_b0,&local_78,10);
          lVar18 = local_40;
        }
        if (pSVar5[lVar13] != '.') goto LAB_00135e31;
        lVar15 = 0;
        goto LAB_00135dd2;
      }
      *(SQChar *)((long)&local_b0 + lVar8) = local_70[lVar13];
      lVar13 = lVar13 + 1;
      lVar8 = lVar8 + 1;
      lVar14 = lVar14 + 1;
      pcVar17 = pcVar17 + 1;
    } while (lVar8 != 3);
    pcVar17 = "width format too long";
    goto LAB_00135e50;
  }
LAB_00135ce9:
  pSVar5[lVar18] = cVar12;
  lVar18 = lVar18 + 1;
  lVar13 = lVar13 + lVar6;
  goto LAB_00136040;
LAB_00135dd2:
  if ((int)*pcVar17 - 0x30U < 10) goto code_r0x00135ddf;
  *(undefined1 *)((long)&local_b0 + lVar15) = 0;
  lVar13 = lVar14;
  if (lVar15 != 0) {
    lVar9 = strtoll((char *)&local_b0,&local_78,10);
    local_a0 = local_a0 + lVar9;
  }
LAB_00135e31:
  v = local_98;
  lVar15 = lVar13 - lVar6;
  if (0x14 < lVar15) {
    pcVar17 = "format too long";
    goto LAB_00135e50;
  }
  memcpy(local_68 + 1,pSVar5 + lVar6,lVar15 + 1);
  local_68[lVar15 + 2] = '\0';
  goto LAB_00135e58;
code_r0x00135ddf:
  *(char *)((long)&local_b0 + lVar15) = *pcVar17;
  lVar15 = lVar15 + 1;
  lVar14 = lVar14 + 1;
  pcVar17 = pcVar17 + 1;
  if (lVar15 == 3) goto code_r0x00135df2;
  goto LAB_00135dd2;
code_r0x00135df2:
  pcVar17 = "precision format too long";
LAB_00135e50:
  v = local_98;
  lVar13 = sq_throwerror(local_98,pcVar17);
LAB_00135e58:
  lVar15 = local_38;
  if (lVar13 < 0) {
    return -1;
  }
  local_78 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_84 = 0.0;
  bVar1 = local_70[lVar13];
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_00135ea9_caseD_65;
    if (bVar1 != 0x58) goto switchD_00135ea9_caseD_68;
switchD_00135ea9_caseD_64:
    sVar10 = strlen(local_68);
    cVar12 = local_68[sVar10 - 1];
    cVar16 = 'l';
    lVar6 = 0;
    do {
      local_68[lVar6 + sVar10 + -1] = cVar16;
      cVar16 = "_call"[lVar6 + 4];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    local_68[sVar10 + 1] = cVar12;
    local_68[sVar10 + 2] = '\0';
switchD_00135ea9_caseD_63:
    SVar11 = sq_getinteger(v,lVar15,(SQInteger *)&local_b0);
    if (-1 < SVar11) {
      lVar6 = local_a0 + 0x65;
      iVar3 = 0x69;
LAB_00135f67:
      local_90 = local_90 + lVar6 + 1;
      pSVar5 = sq_getscratchpad(v,local_90);
      if (iVar3 == 0x66) {
        iVar3 = snprintf(pSVar5 + lVar18,local_90,local_68,(double)local_84);
LAB_00136007:
        lVar18 = lVar18 + iVar3;
      }
      else {
        pcVar17 = local_b0;
        if ((iVar3 == 0x69) || (pcVar17 = local_78, iVar3 == 0x73)) {
          iVar3 = snprintf(pSVar5 + lVar18,local_90,local_68,pcVar17);
          goto LAB_00136007;
        }
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 1;
      bVar2 = true;
      goto LAB_0013603c;
    }
    pcVar17 = "integer expected for the specified format";
  }
  else {
    switch(bVar1) {
    case 99:
      goto switchD_00135ea9_caseD_63;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00135ea9_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00135ea9_caseD_65:
      SVar11 = sq_getfloat(v,local_38,&local_84);
      if (SVar11 < 0) {
        pcVar17 = "float expected for the specified format";
        break;
      }
      lVar6 = local_a0 + 0x65;
      iVar3 = 0x66;
      goto LAB_00135f67;
    default:
switchD_00135ea9_caseD_68:
      pcVar17 = "invalid format";
      break;
    case 0x73:
      SVar11 = sq_getstring(v,local_38,&local_78);
      if (-1 < SVar11) {
        SVar7 = sq_getsize(v,lVar15);
        lVar6 = SVar7 + local_a0 + 1;
        iVar3 = 0x73;
        goto LAB_00135f67;
      }
      pcVar17 = "string expected for the specified format";
    }
  }
  local_a8 = sq_throwerror(v,pcVar17);
  bVar2 = false;
  pSVar5 = local_80;
LAB_0013603c:
  if (!bVar2) {
    return local_a8;
  }
LAB_00136040:
  if (SVar4 <= lVar13) goto LAB_0013608d;
  goto LAB_00135cc9;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    sq_getstring(v,nformatstringidx,&format);
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}